

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

bool __thiscall Board::canMove(Board *this,Block block,int direction)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  uVar4 = block.row;
  uVar7 = block.column;
  iVar1 = block.length;
  lVar5 = (long)block.row;
  lVar8 = (long)block.column;
  bVar3 = Block::isHorizontal(&block);
  if (bVar3) {
    if (direction != 1) {
      if (direction != 0) {
        return false;
      }
      if (this->cells[lVar5 + -1][lVar8 + 5] != 0) {
        return false;
      }
      uVar7 = uVar7 - 1;
      goto LAB_00107051;
    }
    uVar7 = iVar1 + uVar7;
    iVar1 = this->cells[lVar5][(int)uVar7];
  }
  else {
    if (direction == 3) {
      uVar6 = lVar5 + 1;
      uVar2 = uVar6;
    }
    else {
      if (direction != 2) {
        return false;
      }
      uVar4 = uVar4 - iVar1;
      uVar6 = (ulong)uVar4;
      uVar2 = (long)(int)uVar4;
    }
    uVar4 = (uint)uVar6;
    iVar1 = this->cells[uVar2][lVar8];
  }
  if (iVar1 != 0) {
    return false;
  }
LAB_00107051:
  return uVar7 < 6 && uVar4 < 6;
}

Assistant:

bool Board::canMove(Block block, int direction) {
    bool canMoveThere = false;
    int row = block.row;
    int column = block.column;
    int length = block.length;

    // Check the vertical and horizontal blocks separately.
    if (block.isHorizontal()) {
        switch (direction) {
            case LEFT:
                if (isMovable(row, column - 1)) {
                    canMoveThere = true;
                }
                break;
            case RIGHT:
                if (isMovable(row, column + length)) {
                    canMoveThere = true;
                }
                break;
            default:
                break;
        }
    } else {
        switch (direction) {
            case UP:
                if (isMovable(row - length, column)) {
                    canMoveThere = true;
                }
                break;
            case DOWN:
                if (isMovable(row + 1, column)) {
                    canMoveThere = true;
                }
                break;
            default:
                break;
        }
    }
    return canMoveThere;
}